

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O3

void noises(monst *magr,attack *mattk)

{
  int iVar1;
  char *in_RDX;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = dist2((int)(char)magr,(int)(char)mattk,(int)u.ux,(int)u.uy);
  if ((flags.soundok != '\0') &&
     (((bool)far_noise != 0xf < iVar1 || (10 < (long)((ulong)moves - noisetime))))) {
    pcVar3 = "some noises";
    if (*in_RDX == '\r') {
      pcVar3 = "an explosion";
    }
    pcVar2 = "";
    if (0xf < iVar1) {
      pcVar2 = " in the distance";
    }
    far_noise = 0xf < iVar1;
    noisetime = (ulong)moves;
    You_hear("%s%s.",pcVar3,pcVar2);
    return;
  }
  return;
}

Assistant:

static void noises(struct monst *magr, const struct attack *mattk)
{
	boolean farq = (distu(magr->mx, magr->my) > 15);

	if (flags.soundok && (farq != far_noise || moves-noisetime > 10)) {
		far_noise = farq;
		noisetime = moves;
		You_hear("%s%s.",
			(mattk->aatyp == AT_EXPL) ? "an explosion" : "some noises",
			farq ? " in the distance" : "");
	}
}